

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetVulkanDebugOperation
          (DebugInfoManager *this,Instruction *inst)

{
  IRContext *pIVar1;
  ConstantManager *this_00;
  DefUseManager *this_01;
  NonSemanticShaderDebugInfo100Instructions_conflict NVar2;
  uint32_t uVar3;
  Instruction *inst_00;
  Constant *this_02;
  
  NVar2 = Instruction::GetShader100DebugOpcode(inst);
  if (NVar2 == NonSemanticShaderDebugInfo100DebugOperation) {
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(pIVar1);
    }
    this_00 = (pIVar1->constant_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl
    ;
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    this_01 = (pIVar1->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar3 = Instruction::GetSingleWordOperand(inst,4);
    inst_00 = DefUseManager::GetDef(this_01,uVar3);
    this_02 = ConstantManager::GetConstantFromInst(this_00,inst_00);
    uVar3 = Constant::GetU32(this_02);
    return uVar3;
  }
  __assert_fail("inst->GetShader100DebugOpcode() == NonSemanticShaderDebugInfo100DebugOperation && \"inst must be Vulkan DebugOperation\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                ,0x265,
                "uint32_t spvtools::opt::analysis::DebugInfoManager::GetVulkanDebugOperation(Instruction *)"
               );
}

Assistant:

uint32_t DebugInfoManager::GetVulkanDebugOperation(Instruction* inst) {
  assert(inst->GetShader100DebugOpcode() ==
             NonSemanticShaderDebugInfo100DebugOperation &&
         "inst must be Vulkan DebugOperation");
  return context()
      ->get_constant_mgr()
      ->GetConstantFromInst(context()->get_def_use_mgr()->GetDef(
          inst->GetSingleWordOperand(kDebugOperationOperandOperationIndex)))
      ->GetU32();
}